

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  int *piVar1;
  int iVar2;
  ImFont **ppIVar3;
  ImGuiContext *pIVar4;
  ImFont *this_00;
  ImFont **__dest;
  ImFontConfig *pIVar5;
  long lVar6;
  void *__dest_00;
  int iVar7;
  long lVar8;
  char *__function;
  int iVar9;
  ImFontConfig *pIVar10;
  byte bVar11;
  
  pIVar4 = GImGui;
  bVar11 = 0;
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x46d,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->SizePixels <= 0.0) {
    __assert_fail("font_cfg->SizePixels > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x46e,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->MergeMode == false) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    this_00 = (ImFont *)(*(pIVar4->IO).MemAllocFn)(0x68);
    ImFont::ImFont(this_00);
    pIVar4 = GImGui;
    iVar9 = (this->Fonts).Size;
    iVar2 = (this->Fonts).Capacity;
    if (iVar9 == iVar2) {
      iVar9 = iVar9 + 1;
      if (iVar2 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar2 / 2 + iVar2;
      }
      if (iVar9 < iVar7) {
        iVar9 = iVar7;
      }
      if (iVar2 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (ImFont **)(*(pIVar4->IO).MemAllocFn)((long)iVar9 << 3);
        ppIVar3 = (this->Fonts).Data;
        if (ppIVar3 != (ImFont **)0x0) {
          memcpy(__dest,ppIVar3,(long)(this->Fonts).Size << 3);
        }
        ppIVar3 = (this->Fonts).Data;
        if (ppIVar3 != (ImFont **)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(ppIVar3);
        (this->Fonts).Data = __dest;
        (this->Fonts).Capacity = iVar9;
      }
    }
    iVar9 = (this->Fonts).Size;
    (this->Fonts).Size = iVar9 + 1;
    (this->Fonts).Data[iVar9] = this_00;
  }
  pIVar4 = GImGui;
  iVar9 = (this->ConfigData).Size;
  iVar2 = (this->ConfigData).Capacity;
  if (iVar9 == iVar2) {
    iVar9 = iVar9 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar9 < iVar7) {
      iVar9 = iVar7;
    }
    if (iVar2 < iVar9) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar5 = (ImFontConfig *)(*(pIVar4->IO).MemAllocFn)((long)iVar9 * 0x68);
      pIVar10 = (this->ConfigData).Data;
      if (pIVar10 != (ImFontConfig *)0x0) {
        memcpy(pIVar5,pIVar10,(long)(this->ConfigData).Size * 0x68);
      }
      pIVar10 = (this->ConfigData).Data;
      if (pIVar10 != (ImFontConfig *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar10);
      (this->ConfigData).Data = pIVar5;
      (this->ConfigData).Capacity = iVar9;
    }
  }
  iVar9 = (this->ConfigData).Size;
  (this->ConfigData).Size = iVar9 + 1;
  pIVar10 = font_cfg;
  pIVar5 = (this->ConfigData).Data + iVar9;
  for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
    pIVar5->FontData = pIVar10->FontData;
    pIVar10 = (ImFontConfig *)((long)pIVar10 + (ulong)bVar11 * -0x10 + 8);
    pIVar5 = (ImFontConfig *)((long)pIVar5 + (ulong)bVar11 * -0x10 + 8);
  }
  lVar8 = (long)(this->ConfigData).Size;
  if (0 < lVar8) {
    pIVar10 = (this->ConfigData).Data;
    if (pIVar10[lVar8 + -1].DstFont == (ImFont *)0x0) {
      lVar6 = (long)(this->Fonts).Size;
      if (lVar6 < 1) {
        __function = "value_type &ImVector<ImFont *>::back() [T = ImFont *]";
        goto LAB_00154401;
      }
      pIVar10[lVar8 + -1].DstFont = (this->Fonts).Data[lVar6 + -1];
    }
    pIVar4 = GImGui;
    if (pIVar10[lVar8 + -1].FontDataOwnedByAtlas == false) {
      iVar9 = pIVar10[lVar8 + -1].FontDataSize;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest_00 = (*(pIVar4->IO).MemAllocFn)((long)iVar9);
      pIVar10[lVar8 + -1].FontData = __dest_00;
      pIVar10[lVar8 + -1].FontDataOwnedByAtlas = true;
      memcpy(__dest_00,font_cfg->FontData,(long)pIVar10[lVar8 + -1].FontDataSize);
    }
    ClearTexData(this);
    return pIVar10[lVar8 + -1].DstFont;
  }
  __function = "value_type &ImVector<ImFontConfig>::back() [T = ImFontConfig]";
LAB_00154401:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                ,0x35d,__function);
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
    {
        ImFont* font = (ImFont*)ImGui::MemAlloc(sizeof(ImFont));
        IM_PLACEMENT_NEW(font) ImFont();
        Fonts.push_back(font);
    }

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
	if (!new_font_cfg.DstFont)
	    new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}